

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O2

void Min_CubeCreate(Vec_Str_t *vCover,Min_Cube_t *pCube,char Type)

{
  uint uVar1;
  char cVar2;
  char Entry;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  
  uVar3 = *(uint *)&pCube->field_0x8;
  uVar1 = Min_CubeCountLits(pCube);
  if (uVar3 >> 0x16 == uVar1) {
    bVar4 = 0;
    for (uVar1 = 0; uVar1 < (uVar3 & 0x3ff); uVar1 = uVar1 + 1) {
      bVar5 = (pCube->uData[uVar1 >> 4] >> (bVar4 & 0x1e) & 2) == 0;
      cVar2 = '1';
      if (bVar5) {
        cVar2 = '?';
      }
      Entry = bVar5 * '\x03' + '-';
      if ((pCube->uData[uVar1 >> 4] >> (bVar4 & 0x1e) & 1) == 0) {
        Entry = cVar2;
      }
      Vec_StrPush(vCover,Entry);
      uVar3 = *(uint *)&pCube->field_0x8;
      bVar4 = bVar4 + 2;
    }
    Vec_StrPush(vCover,' ');
    Vec_StrPush(vCover,Type);
    Vec_StrPush(vCover,'\n');
    return;
  }
  __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/cov/covMinUtil.c"
                ,0x30,"void Min_CubeCreate(Vec_Str_t *, Min_Cube_t *, char)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Min_CubeCreate( Vec_Str_t * vCover, Min_Cube_t * pCube, char Type )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
//                fprintf( pFile, "-" );
                Vec_StrPush( vCover, '-' );
            else
//                fprintf( pFile, "0" );
                Vec_StrPush( vCover, '0' );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
 //               fprintf( pFile, "1" );
                Vec_StrPush( vCover, '1' );
            else
//                fprintf( pFile, "?" );
                Vec_StrPush( vCover, '?' );
        }
//    fprintf( pFile, " 1\n" );
    Vec_StrPush( vCover, ' ' );
    Vec_StrPush( vCover, Type );
    Vec_StrPush( vCover, '\n' );
}